

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int Synchronize_Field(FIELD *field)

{
  FORM *form_00;
  int local_24;
  int res;
  FORM *form;
  FIELD *field_local;
  
  local_24 = 0;
  if (field == (FIELD *)0x0) {
    field_local._4_4_ = -2;
  }
  else {
    form_00 = field->form;
    if ((((form_00 != (FORM *)0x0) && (field->form != (formnode *)0x0)) &&
        ((field->form->status & 1) != 0)) &&
       (((field->opts & 1U) != 0 && (field->page == field->form->curpage)))) {
      if (field == form_00->current) {
        form_00->begincol = 0;
        form_00->toprow = 0;
        form_00->curcol = 0;
        form_00->currow = 0;
        werase(form_00->w);
        if ((((field->opts & 4U) == 0) || (field->just == 0)) ||
           (((int)field->rows + field->nrow != 1 ||
            ((field->dcols != (int)field->cols || ((field->opts & 0x200U) == 0)))))) {
          Buffer_To_Window(field,form_00->w);
        }
        else {
          Undo_Justification(field,form_00->w);
        }
        field->status = field->status | 2;
        local_24 = _nc_Refresh_Current_Field(form_00);
      }
      else {
        local_24 = Display_Or_Erase_Field(field,false);
      }
    }
    field->status = field->status | 1;
    field_local._4_4_ = local_24;
  }
  return field_local._4_4_;
}

Assistant:

static int Synchronize_Field(FIELD * field)
{
  FORM *form;
  int res = E_OK;

  if (!field)
    return(E_BAD_ARGUMENT);

  if (((form=field->form) != (FORM *)0)
      && Field_Really_Appears(field))
    {
      if (field == form->current)
        { 
          form->currow  = form->curcol = form->toprow = form->begincol = 0;
          werase(form->w);
      
          if ( (field->opts & O_PUBLIC) && Justification_Allowed(field) )
            Undo_Justification( field, form->w );
          else
            Buffer_To_Window( field, form->w );
          
          field->status |= _NEWTOP;
          res = _nc_Refresh_Current_Field( form );
        }
      else
        res = Display_Field( field );
    }
  field->status |= _CHANGED;
  return(res);
}